

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomGradient::read(DomGradient *this,int __fd,void *__buf,size_t __nbytes)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  DomGradientStop *this_00;
  QXmlStreamAttribute *pQVar4;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_01;
  long lVar5;
  long in_FS_OFFSET;
  QStringView other;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_01 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  pQVar4 = local_50.ptr;
  for (lVar5 = 0; local_50.size * 0x68 != lVar5; lVar5 = lVar5 + 0x68) {
    local_68.m_data = *(storage_type_conflict **)(pQVar4 + 8);
    local_68.m_size = *(qsizetype *)(pQVar4 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"startx",6);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar2) {
      local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
      local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
      dVar1 = (double)QStringView::toDouble((bool *)&local_80);
      this->m_attr_startX = dVar1;
      this->m_has_attr_startX = true;
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"starty",6);
      local_98.a.m_size = local_80.size;
      local_98.a.m_data = (char *)local_80.ptr;
      bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (bVar2) {
        local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
        local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_startY = dVar1;
        this->m_has_attr_startY = true;
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"endx",4);
        local_98.a.m_size = local_80.size;
        local_98.a.m_data = (char *)local_80.ptr;
        bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        if (bVar2) {
          local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
          local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
          dVar1 = (double)QStringView::toDouble((bool *)&local_80);
          this->m_attr_endX = dVar1;
          this->m_has_attr_endX = true;
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"endy",4);
          local_98.a.m_size = local_80.size;
          local_98.a.m_data = (char *)local_80.ptr;
          bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          if (bVar2) {
            local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
            local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
            dVar1 = (double)QStringView::toDouble((bool *)&local_80);
            this->m_attr_endY = dVar1;
            this->m_has_attr_endY = true;
          }
          else {
            Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"centralx",8);
            local_98.a.m_size = local_80.size;
            local_98.a.m_data = (char *)local_80.ptr;
            bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            if (bVar2) {
              local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
              local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
              dVar1 = (double)QStringView::toDouble((bool *)&local_80);
              this->m_attr_centralX = dVar1;
              this->m_has_attr_centralX = true;
            }
            else {
              Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"centraly",8);
              local_98.a.m_size = local_80.size;
              local_98.a.m_data = (char *)local_80.ptr;
              bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              if (bVar2) {
                local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
                local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
                dVar1 = (double)QStringView::toDouble((bool *)&local_80);
                this->m_attr_centralY = dVar1;
                this->m_has_attr_centralY = true;
              }
              else {
                Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"focalx",6);
                local_98.a.m_size = local_80.size;
                local_98.a.m_data = (char *)local_80.ptr;
                bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                if (bVar2) {
                  local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
                  local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
                  dVar1 = (double)QStringView::toDouble((bool *)&local_80);
                  this->m_attr_focalX = dVar1;
                  this->m_has_attr_focalX = true;
                }
                else {
                  Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"focaly",6);
                  local_98.a.m_size = local_80.size;
                  local_98.a.m_data = (char *)local_80.ptr;
                  bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                  if (bVar2) {
                    local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
                    local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
                    dVar1 = (double)QStringView::toDouble((bool *)&local_80);
                    this->m_attr_focalY = dVar1;
                    this->m_has_attr_focalY = true;
                  }
                  else {
                    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"radius",6);
                    local_98.a.m_size = local_80.size;
                    local_98.a.m_data = (char *)local_80.ptr;
                    bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                    if (bVar2) {
                      local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
                      local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
                      dVar1 = (double)QStringView::toDouble((bool *)&local_80);
                      this->m_attr_radius = dVar1;
                      this->m_has_attr_radius = true;
                    }
                    else {
                      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"angle",5);
                      local_98.a.m_size = local_80.size;
                      local_98.a.m_data = (char *)local_80.ptr;
                      bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                      if (bVar2) {
                        local_80.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
                        local_80.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
                        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
                        this->m_attr_angle = dVar1;
                        this->m_has_attr_angle = true;
                      }
                      else {
                        Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"type",4);
                        local_98.a.m_size = local_80.size;
                        local_98.a.m_data = (char *)local_80.ptr;
                        bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                        if (bVar2) {
                          local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
                          local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
                          QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
                          setAttributeType(this,(QString *)&local_80);
                        }
                        else {
                          Qt::Literals::StringLiterals::operator____s
                                    ((QString *)&local_80,L"spread",6);
                          local_98.a.m_size = local_80.size;
                          local_98.a.m_data = (char *)local_80.ptr;
                          bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                          if (bVar2) {
                            local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
                            local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
                            QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
                            setAttributeSpread(this,(QString *)&local_80);
                          }
                          else {
                            Qt::Literals::StringLiterals::operator____s
                                      ((QString *)&local_80,L"coordinatemode",0xe);
                            local_98.a.m_size = local_80.size;
                            local_98.a.m_data = (char *)local_80.ptr;
                            bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                            if (bVar2) {
                              local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
                              local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
                              QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
                              setAttributeCoordinateMode(this,(QString *)&local_80);
                            }
                            else {
                              local_98.a.m_size = 0x15;
                              local_98.a.m_data = "Unexpected attribute ";
                              local_98.b = &local_68;
                              QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                                        ((QString *)&local_80,&local_98);
                              QXmlStreamReader::raiseError((QString *)this_01);
                            }
                          }
                        }
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    pQVar4 = pQVar4 + 0x68;
  }
  do {
    while( true ) {
      bVar2 = QXmlStreamReader::hasError(this_01);
      if (bVar2) goto LAB_00158a97;
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 != 4) break;
      local_68.m_size = -0x5555555555555556;
      local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_68 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"gradientstop",0xc);
      __nbytes_00 = 0;
      other.m_data = local_80.ptr;
      other.m_size = local_80.size;
      iVar3 = QStringView::compare(&local_68,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (iVar3 == 0) {
        this_00 = (DomGradientStop *)operator_new(0x18);
        this_00->m_attr_position = 0.0;
        this_00->m_has_attr_position = false;
        *(undefined3 *)&this_00->field_0x9 = 0;
        this_00->m_children = 0;
        this_00->m_color = (DomColor *)0x0;
        DomGradientStop::read(this_00,__fd,__buf_00,__nbytes_00);
        QList<DomGradientStop_*>::append(&this->m_gradientStop,this_00);
      }
      else {
        local_98.a.m_size = 0x13;
        local_98.a.m_data = "Unexpected element ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                  ((QString *)&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)this_01);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      }
    }
  } while (iVar3 != 5);
LAB_00158a97:
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomGradient::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"startx"_s) {
            setAttributeStartX(attribute.value().toDouble());
            continue;
        }
        if (name == u"starty"_s) {
            setAttributeStartY(attribute.value().toDouble());
            continue;
        }
        if (name == u"endx"_s) {
            setAttributeEndX(attribute.value().toDouble());
            continue;
        }
        if (name == u"endy"_s) {
            setAttributeEndY(attribute.value().toDouble());
            continue;
        }
        if (name == u"centralx"_s) {
            setAttributeCentralX(attribute.value().toDouble());
            continue;
        }
        if (name == u"centraly"_s) {
            setAttributeCentralY(attribute.value().toDouble());
            continue;
        }
        if (name == u"focalx"_s) {
            setAttributeFocalX(attribute.value().toDouble());
            continue;
        }
        if (name == u"focaly"_s) {
            setAttributeFocalY(attribute.value().toDouble());
            continue;
        }
        if (name == u"radius"_s) {
            setAttributeRadius(attribute.value().toDouble());
            continue;
        }
        if (name == u"angle"_s) {
            setAttributeAngle(attribute.value().toDouble());
            continue;
        }
        if (name == u"type"_s) {
            setAttributeType(attribute.value().toString());
            continue;
        }
        if (name == u"spread"_s) {
            setAttributeSpread(attribute.value().toString());
            continue;
        }
        if (name == u"coordinatemode"_s) {
            setAttributeCoordinateMode(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"gradientstop"_s, Qt::CaseInsensitive)) {
                auto *v = new DomGradientStop();
                v->read(reader);
                m_gradientStop.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}